

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *unaff_RBP;
  bool bVar4;
  char *__s1;
  undefined4 local_38;
  int local_34;
  
  if (argc != 1) {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"-h");
    if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"--help"), iVar1 != 0)) {
      iVar1 = strcmp(__s1,"-v");
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"--version"), iVar1 == 0)) {
        print_version();
        goto LAB_00101a01;
      }
      if ((argc < 3) || (iVar1 = strcmp(__s1,"-D"), iVar1 != 0)) {
        iVar2 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        iVar1 = 1;
        if (iVar2 == 0) goto LAB_001017ff;
LAB_00101a1c:
        main_cold_1();
LAB_00101a21:
        main_cold_8();
LAB_00101a26:
        main_cold_5();
LAB_00101a2b:
        main_cold_9();
      }
      else {
        coda_set_definition_path(argv[2]);
        iVar1 = 3;
LAB_001017ff:
        bVar4 = iVar1 < argc;
        if (iVar1 < argc) {
          local_38 = 1;
          local_34 = 0;
          do {
            __s1 = (char *)(long)iVar1;
            unaff_RBP = argv[(long)__s1];
            iVar2 = strcmp(unaff_RBP,"-c");
            if ((iVar2 == 0) || (iVar2 = strcmp(unaff_RBP,"--check"), iVar2 == 0)) {
              local_34 = 1;
            }
            else {
              iVar2 = strcmp(unaff_RBP,"-d");
              if ((iVar2 == 0) || (iVar2 = strcmp(unaff_RBP,"--disable_conversions"), iVar2 == 0)) {
                local_38 = 0;
              }
              else {
                iVar2 = strcmp(unaff_RBP,"-p");
                if (iVar2 != 0) goto LAB_001018dc;
                iVar2 = iVar1 + 1;
                if (argc <= iVar2) goto LAB_001018dc;
                if (*argv[iVar2] == '-') goto LAB_001018dc;
                iVar3 = coda_expression_from_string(argv[iVar2],&node_expr);
                iVar1 = iVar2;
                if (iVar3 != 0) {
                  main_cold_2();
                  goto LAB_001019f5;
                }
              }
            }
            iVar1 = iVar1 + 1;
            bVar4 = iVar1 < argc;
          } while (iVar1 < argc);
        }
        do {
          main_cold_12();
LAB_001018dc:
          if (*unaff_RBP == '-') {
            main_cold_11();
            goto LAB_00101a0d;
          }
        } while (!bVar4);
        iVar2 = coda_expression_from_string(argv[(long)__s1],&eval_expr);
        if (iVar2 != 0) {
LAB_00101a0d:
          main_cold_3();
LAB_00101a12:
          main_cold_4();
LAB_00101a17:
          main_cold_10();
          goto LAB_00101a1c;
        }
        iVar2 = coda_expression_get_type(eval_expr,&expr_type);
        if (iVar2 != 0) goto LAB_00101a12;
        if ((expr_type & ~coda_expression_integer) == coda_expression_node) goto LAB_00101a17;
        if (local_34 != 0) {
LAB_001019c2:
          coda_expression_delete(eval_expr);
          if (node_expr != (coda_expression *)0x0) {
            coda_expression_delete();
          }
          return 0;
        }
        iVar1 = iVar1 + 1;
        if (argc - iVar1 != 0 && iVar1 <= argc) {
          iVar2 = coda_init();
          if (iVar2 != 0) goto LAB_00101a21;
          coda_set_option_perform_conversions(local_38);
          iVar1 = coda_match_filefilter(0,argc - iVar1,argv + iVar1,callback,0);
          if (iVar1 == 0) {
            coda_done();
            goto LAB_001019c2;
          }
          goto LAB_00101a2b;
        }
        if (node_expr != (coda_expression *)0x0) goto LAB_00101a26;
        iVar1 = coda_expression_is_constant();
        if (iVar1 != 0) {
          iVar1 = eval_expression((coda_cursor *)0x0);
          if (iVar1 == 0) goto LAB_001019c2;
          goto LAB_00101a35;
        }
      }
      main_cold_7();
LAB_00101a35:
      main_cold_6();
      puts("Usage:");
      puts("    codaeval [-D definitionpath] [<options>] expression [<files|directories>]");
      puts("        Evaluate a CODA expression on a series of files and/or recursively on");
      puts("        all contents of directories");
      puts("        If no files or directories are provided then codaeval should be a");
      puts("        \'constant\' expression (i.e. it may not contain node expressions or");
      puts("        functions that rely on product content)");
      putchar(10);
      puts("        Options:");
      puts("            -c, --check");
      puts("                    only check the syntax of the expression, without evaluating");
      puts("                    it; any remaining options (including files) will be ignored");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -p \'<path>\'");
      puts("                    a path (in the form of a CODA node expression) to the");
      puts("                    location in the product where the expression should be");
      puts("                    evaluated");
      puts("                    if no path is provided the expression will be evaluated");
      puts("                    at the root of the product");
      putchar(10);
      puts("    A description of the syntax of CODA expression language can be found in the");
      puts("    CODA documentation");
      putchar(10);
      puts("    codaeval h, --help");
      puts("        Show help (this text)");
      putchar(10);
      puts("    codaeval -v, --version");
      puts("        Print the version number of CODA and exit");
      putchar(10);
      puts("    CODA will look for .codadef files using a definition path, which is a");
      puts("    \':\' separated (\';\' on Windows) list of paths to .codadef files and/or");
      puts("    to directories containing .codadef files.");
      puts("    By default the definition path is set to a single directory relative");
      puts("    to the tool location. A different definition path can be set via the");
      puts("    CODA_DEFINITION environment variable or via the -D option.");
      puts("    (the -D option overrides the environment variable setting).");
      iVar1 = putchar(10);
      return iVar1;
    }
  }
LAB_001019f5:
  print_help();
LAB_00101a01:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int perform_conversions;
    int check_only;
    int i;

    perform_conversions = 1;
    check_only = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-c") == 0 || strcmp(argv[i], "--check") == 0)
        {
            check_only = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if (strcmp(argv[i], "-p") == 0 && i + 1 < argc && argv[i + 1][0] != '-')
        {
            if (coda_expression_from_string(argv[i + 1], &node_expr))
            {
                fprintf(stderr, "ERROR: error in path expression: %s\n", coda_errno_to_string(coda_errno));
                exit(1);
            }
            i++;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are the expression and the optional list of files/directories */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    /* expression parameter */
    if (i >= argc)
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }
    if (coda_expression_from_string(argv[i], &eval_expr) != 0)
    {
        fprintf(stderr, "ERROR: error in expression: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    i++;

    if (coda_expression_get_type(eval_expr, &expr_type) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    if (expr_type == coda_expression_node || expr_type == coda_expression_void)
    {
        fprintf(stderr, "ERROR: expression cannot be a '%s' expression\n", coda_expression_get_type_name(expr_type));
        exit(1);
    }

    if (check_only)
    {
        coda_expression_delete(eval_expr);
        if (node_expr != NULL)
        {
            coda_expression_delete(node_expr);
        }

        return 0;
    }

    if (i < argc)
    {
        if (coda_init() != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_set_option_perform_conversions(perform_conversions);

        if (coda_match_filefilter(NULL, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_done();
    }
    else
    {
        if (node_expr != NULL)
        {
            fprintf(stderr, "ERROR: invalid arguments (path expression is only allowed if a file/directory list is "
                    "provided)\n");
            exit(1);
        }
        if (!coda_expression_is_constant(eval_expr))
        {
            fprintf(stderr, "ERROR: invalid arguments (file/directory list needs to be provided if expression is not "
                    "a constant expression)\n");
            exit(1);
        }
        if (eval_expression(NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    coda_expression_delete(eval_expr);
    if (node_expr != NULL)
    {
        coda_expression_delete(node_expr);
    }

    return 0;
}